

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_promise_resolve_function_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue v;
  long in_RSI;
  JSValueUnion in_RDI;
  JSPromiseFunctionData *s;
  JSPromiseFunctionDataResolved *in_stack_ffffffffffffffd8;
  JSRuntime *rt_00;
  
  rt_00 = *(JSRuntime **)(in_RSI + 0x30);
  if (rt_00 != (JSRuntime *)0x0) {
    js_promise_resolve_function_free_resolved(rt_00,in_stack_ffffffffffffffd8);
    v.tag = in_RSI;
    v.u.float64 = in_RDI.float64;
    JS_FreeValueRT(rt_00,v);
    js_free_rt(rt_00,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void js_promise_resolve_function_finalizer(JSRuntime *rt, JSValue val)
{
    JSPromiseFunctionData *s = JS_VALUE_GET_OBJ(val)->u.promise_function_data;
    if (s) {
        js_promise_resolve_function_free_resolved(rt, s->presolved);
        JS_FreeValueRT(rt, s->promise);
        js_free_rt(rt, s);
    }
}